

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O2

CompiledModule * __thiscall
capnp::compiler::Compiler::Impl::addInternal(Impl *this,Module *parsedModule)

{
  mapped_type *this_00;
  CompiledModule *pCVar1;
  Own<capnp::compiler::Compiler::CompiledModule,_std::nullptr_t> local_30;
  
  local_30.disposer = (Disposer *)parsedModule;
  this_00 = std::__detail::
            _Map_base<capnp::compiler::Module_*,_std::pair<capnp::compiler::Module_*const,_kj::Own<capnp::compiler::Compiler::CompiledModule,_std::nullptr_t>_>,_std::allocator<std::pair<capnp::compiler::Module_*const,_kj::Own<capnp::compiler::Compiler::CompiledModule,_std::nullptr_t>_>_>,_std::__detail::_Select1st,_std::equal_to<capnp::compiler::Module_*>,_std::hash<capnp::compiler::Module_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<capnp::compiler::Module_*,_std::pair<capnp::compiler::Module_*const,_kj::Own<capnp::compiler::Compiler::CompiledModule,_std::nullptr_t>_>,_std::allocator<std::pair<capnp::compiler::Module_*const,_kj::Own<capnp::compiler::Compiler::CompiledModule,_std::nullptr_t>_>_>,_std::__detail::_Select1st,_std::equal_to<capnp::compiler::Module_*>,_std::hash<capnp::compiler::Module_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->modules,(key_type *)&local_30);
  pCVar1 = this_00->ptr;
  if (pCVar1 == (CompiledModule *)0x0) {
    kj::
    heap<capnp::compiler::Compiler::CompiledModule,capnp::compiler::Compiler::Impl&,capnp::compiler::Module&>
              ((kj *)&local_30,this,parsedModule);
    kj::Own<capnp::compiler::Compiler::CompiledModule,_std::nullptr_t>::operator=(this_00,&local_30)
    ;
    if (local_30.ptr != (CompiledModule *)0x0) {
      local_30.ptr = (CompiledModule *)0x0;
      (**((ErrorReporter *)&(local_30.disposer)->_vptr_Disposer)->_vptr_ErrorReporter)();
    }
    pCVar1 = this_00->ptr;
  }
  return pCVar1;
}

Assistant:

Compiler::CompiledModule& Compiler::Impl::addInternal(Module& parsedModule) {
  kj::Own<CompiledModule>& slot = modules[&parsedModule];
  if (slot.get() == nullptr) {
    slot = kj::heap<CompiledModule>(*this, parsedModule);
  }

  return *slot;
}